

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_coding.h
# Opt level: O2

uint16_t float_to_half(float fv)

{
  char cVar1;
  ushort uVar2;
  float fVar3;
  uint uVar4;
  
  fVar3 = ABS(fv);
  uVar2 = (ushort)((uint)fv >> 0x10) & 0x8000;
  if ((uint)fVar3 < 0x38800000) {
    if ((0x33000000 < (uint)fVar3) &&
       (uVar4 = (uint)fv & 0x7fffff | 0x800000, cVar1 = (char)((uint)fVar3 >> 0x17),
       uVar2 = uVar2 | (ushort)(uVar4 >> (0x7eU - cVar1 & 0x1f)),
       0x80000000 < uVar4 << (cVar1 + 0xa2U & 0x1f))) {
      return uVar2 + 1;
    }
  }
  else if ((uint)fVar3 < 0x7f800000) {
    if (0x477fefff < (uint)fVar3) {
      return uVar2 | 0x7c00;
    }
    uVar2 = (ushort)((int)fVar3 + 0x8000fffU + (uint)(((uint)fVar3 >> 0xd & 1) != 0) >> 0xd) | uVar2
    ;
  }
  else {
    uVar2 = uVar2 | 0x7c00;
    if (fVar3 != INFINITY) {
      uVar4 = (uint)fVar3 >> 0xd & 0x3ff;
      return uVar2 | (ushort)uVar4 | (ushort)(uVar4 == 0);
    }
  }
  return uVar2;
}

Assistant:

static inline uint16_t
float_to_half (float fv)
{
#ifdef IMATH_HALF_SAFE_FOR_C
    return imath_float_to_half (fv);
#else
    union
    {
        uint32_t i;
        float    f;
    } v;
    uint16_t ret;
    uint32_t e, m, ui, r, shift;

    v.f = fv;
    ui  = (v.i & ~0x80000000);
    ret = ((v.i >> 16) & 0x8000);

    if (ui >= 0x38800000)
    {
        if (OUR_UNLIKELY (ui >= 0x7f800000))
        {
            ret |= 0x7c00;
            if (ui == 0x7f800000) return ret;
            m = (ui & 0x7fffff) >> 13;
            return (uint16_t) (ret | m | (m == 0));
        }

        if (OUR_UNLIKELY (ui > 0x477fefff)) return ret | 0x7c00;

        ui -= 0x38000000;
        ui = ((ui + 0x00000fff + ((ui >> 13) & 1)) >> 13);
        return (uint16_t) (ret | ui);
    }

    // zero or flush to 0
    if (ui < 0x33000001) return ret;

    // produce a denormalized half
    e     = (ui >> 23);
    shift = 0x7e - e;
    m     = 0x800000 | (ui & 0x7fffff);
    r     = m << (32 - shift);
    ret |= (m >> shift);
    if (r > 0x80000000 || (r == 0x80000000 && (ret & 0x1) != 0)) ++ret;
    return ret;
#endif
}